

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CEseqFloatVisitor.cpp
# Opt level: O3

void __thiscall IRT::CEseqFloatVisitor::Visit(CEseqFloatVisitor *this,CCallExpression *expression)

{
  CStatement *pCVar1;
  CExpression *pCVar2;
  undefined8 uVar3;
  CExpressionList *pCVar4;
  vector<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
  *pvVar5;
  CSeqStatement *this_00;
  CEseqExpression *this_01;
  CCallExpression *pCVar6;
  int i;
  ulong uVar7;
  CSeqStatement *pCVar8;
  CEseqFloatVisitor *pCVar9;
  CEseqFloatVisitor *this_02;
  vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
  helpStatements;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_a8;
  _Head_base<0UL,_const_IRT::CStatement_*,_false> local_a0;
  undefined1 local_98 [40];
  undefined1 local_70 [24];
  undefined1 local_58 [16];
  __uniq_ptr_impl<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
  local_48;
  CEseqFloatVisitor *local_40;
  CCallExpression *local_38;
  
  pCVar4 = CCallExpression::getArguments(expression);
  (**(pCVar4->super_IExpression).super_INode._vptr_INode)(pCVar4);
  this_02 = (CEseqFloatVisitor *)
            (this->childExpressionList)._M_t.
            super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
            ._M_t.
            super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
            .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl;
  (this->childExpressionList)._M_t.
  super___uniq_ptr_impl<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
  ._M_t.
  super__Tuple_impl<0UL,_const_IRT::CExpressionList_*,_std::default_delete<const_IRT::CExpressionList>_>
  .super__Head_base<0UL,_const_IRT::CExpressionList_*,_false>._M_head_impl = (CExpressionList *)0x0;
  pvVar5 = CExpressionList::getExpressions((CExpressionList *)this_02);
  if ((pvVar5->
      super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish ==
      (pvVar5->
      super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start) {
    pCVar6 = (CCallExpression *)operator_new(0x18);
    CCallExpression::getFunction(expression);
    CNameExpression::CopyCast((CNameExpression *)local_98);
    local_48._M_t.
    super__Tuple_impl<0UL,_const_IRT::CNameExpression_*,_std::default_delete<const_IRT::CNameExpression>_>
    .super__Head_base<0UL,_const_IRT::CNameExpression_*,_false>._M_head_impl =
         (tuple<const_IRT::CNameExpression_*,_std::default_delete<const_IRT::CNameExpression>_>)
         (tuple<const_IRT::CNameExpression_*,_std::default_delete<const_IRT::CNameExpression>_>)
         local_98._0_8_;
    local_98._0_8_ = (CEseqFloatVisitor *)0x0;
    local_58._8_8_ = this_02;
    CCallExpression::CCallExpression
              (pCVar6,(unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                       *)&local_48,
               (unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
                *)(local_58 + 8));
    pCVar2 = (this->childExpression)._M_t.
             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    (this->childExpression)._M_t.
    super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t
    .super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)pCVar6;
    if (pCVar2 != (CExpression *)0x0) {
      (**(code **)((long)(pCVar2->super_IExpression).super_INode + 0x10))();
    }
    if ((CEseqFloatVisitor *)local_58._8_8_ != (CEseqFloatVisitor *)0x0) {
      (**(code **)(*(long *)local_58._8_8_ + 0x10))();
    }
    local_58._8_8_ = 0;
    if (local_48._M_t.
        super__Tuple_impl<0UL,_const_IRT::CNameExpression_*,_std::default_delete<const_IRT::CNameExpression>_>
        .super__Head_base<0UL,_const_IRT::CNameExpression_*,_false>._M_head_impl !=
        (_Tuple_impl<0UL,_const_IRT::CNameExpression_*,_std::default_delete<const_IRT::CNameExpression>_>
         )0x0) {
      (**(code **)((long)*(__uniq_ptr_data<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>,_true,_true>
                           *)local_48._M_t.
                             super__Tuple_impl<0UL,_const_IRT::CNameExpression_*,_std::default_delete<const_IRT::CNameExpression>_>
                             .super__Head_base<0UL,_const_IRT::CNameExpression_*,_false>.
                             _M_head_impl + 0x10))();
    }
    local_48._M_t.
    super__Tuple_impl<0UL,_const_IRT::CNameExpression_*,_std::default_delete<const_IRT::CNameExpression>_>
    .super__Head_base<0UL,_const_IRT::CNameExpression_*,_false>._M_head_impl =
         (tuple<const_IRT::CNameExpression_*,_std::default_delete<const_IRT::CNameExpression>_>)
         (_Tuple_impl<0UL,_const_IRT::CNameExpression_*,_std::default_delete<const_IRT::CNameExpression>_>
          )0x0;
    this_02 = (CEseqFloatVisitor *)local_98._0_8_;
    if ((CEseqFloatVisitor *)local_98._0_8_ == (CEseqFloatVisitor *)0x0) {
      return;
    }
  }
  else {
    local_98._0_8_ = (CEseqFloatVisitor *)0x0;
    local_98._8_8_ = (pointer)0x0;
    local_98._16_8_ = (pointer)0x0;
    pCVar4 = (CExpressionList *)operator_new(0x20);
    CExpressionList::CExpressionList(pCVar4,(CExpression *)0x0);
    for (uVar7 = 0; pvVar5 = CExpressionList::getExpressions((CExpressionList *)this_02),
        uVar7 < (ulong)((long)(pvVar5->
                              super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish -
                        (long)(pvVar5->
                              super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start >> 3); uVar7 = uVar7 + 1) {
      pCVar9 = this_02;
      pvVar5 = CExpressionList::getExpressions((CExpressionList *)this_02);
      processCallArgument(pCVar9,(CExpression *)
                                 (pvVar5->
                                 super__Vector_base<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>,_std::allocator<std::unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>_>_>
                                 )._M_impl.super__Vector_impl_data._M_start[uVar7]._M_t.
                                 super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
                                 ._M_t,pCVar4,
                          (vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
                           *)local_98);
    }
    this_00 = (CSeqStatement *)
              (((pointer)(local_98._8_8_ + -8))->_M_t).
              super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
              ._M_t.
              super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
              .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    (((pointer)(local_98._8_8_ + -8))->_M_t).
    super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>._M_t.
    super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>.
    super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl = (CStatement *)0x0;
    pCVar9 = (CEseqFloatVisitor *)(local_98._8_8_ + -8);
    pCVar1 = (((pointer)(local_98._8_8_ + -8))->_M_t).
             super___uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
             .super__Head_base<0UL,_const_IRT::CStatement_*,_false>._M_head_impl;
    local_98._8_8_ = pCVar9;
    local_40 = this;
    local_38 = expression;
    if (pCVar1 != (CStatement *)0x0) {
      (**(code **)((long)(pCVar1->super_IStatement).super_INode + 0x10))();
    }
    ((INode *)&(pCVar9->super_IVisitor)._vptr_IVisitor)->_vptr_INode = (_func_int **)0x0;
    if (local_98._8_8_ != local_98._0_8_) {
      uVar7 = 0;
      pCVar8 = this_00;
      do {
        uVar3 = local_98._0_8_;
        this_00 = (CSeqStatement *)operator_new(0x18);
        local_58._0_8_ =
             ((_Tuple_impl<0UL,_const_IRT::CStatement_*,_std::default_delete<const_IRT::CStatement>_>
               *)(uVar3 + uVar7 * 8))->super__Head_base<0UL,_const_IRT::CStatement_*,_false>;
        *(_func_int **)(uVar3 + uVar7 * 8) = (_func_int *)0x0;
        local_a0._M_head_impl = &pCVar8->super_CStatement;
        CSeqStatement::CSeqStatement
                  (this_00,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                            *)local_58,
                   (unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_> *
                   )&local_a0);
        if ((CSeqStatement *)local_a0._M_head_impl != (CSeqStatement *)0x0) {
          (*((INode *)&((local_a0._M_head_impl)->super_IStatement).super_INode._vptr_INode)->
            _vptr_INode[2])();
        }
        local_a0._M_head_impl = (CStatement *)0x0;
        if ((_Head_base<0UL,_const_IRT::CStatement_*,_false>)local_58._0_8_ !=
            (_Head_base<0UL,_const_IRT::CStatement_*,_false>)0x0) {
          (**(code **)((long)*(IStatement *)local_58._0_8_ + 0x10))();
        }
        local_58._0_8_ =
             (__uniq_ptr_impl<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>)
             0x0;
        uVar7 = uVar7 + 1;
        pCVar8 = this_00;
      } while (uVar7 < (ulong)((long)(local_98._8_8_ - local_98._0_8_) >> 3));
    }
    this_01 = (CEseqExpression *)operator_new(0x18);
    local_a8._M_head_impl = &this_00->super_CStatement;
    pCVar6 = (CCallExpression *)operator_new(0x18);
    CCallExpression::getFunction(local_38);
    CNameExpression::CopyCast((CNameExpression *)local_70);
    local_70._8_8_ = local_70._0_8_;
    local_70._0_8_ = (_func_int **)0x0;
    local_98._32_8_ = pCVar4;
    CCallExpression::CCallExpression
              (pCVar6,(unique_ptr<const_IRT::CNameExpression,_std::default_delete<const_IRT::CNameExpression>_>
                       *)(local_70 + 8),
               (unique_ptr<const_IRT::CExpressionList,_std::default_delete<const_IRT::CExpressionList>_>
                *)(local_98 + 0x20));
    local_70._16_8_ = pCVar6;
    CEseqExpression::CEseqExpression
              (this_01,(unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>
                        *)&local_a8,
               (unique_ptr<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_> *)
               (local_70 + 0x10));
    pCVar2 = (local_40->childExpression)._M_t.
             super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>
             ._M_t.
             super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>
             .super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl;
    (local_40->childExpression)._M_t.
    super___uniq_ptr_impl<const_IRT::CExpression,_std::default_delete<const_IRT::CExpression>_>._M_t
    .super__Tuple_impl<0UL,_const_IRT::CExpression_*,_std::default_delete<const_IRT::CExpression>_>.
    super__Head_base<0UL,_const_IRT::CExpression_*,_false>._M_head_impl = (CExpression *)this_01;
    if (pCVar2 != (CExpression *)0x0) {
      (**(code **)((long)(pCVar2->super_IExpression).super_INode + 0x10))();
    }
    if ((CCallExpression *)local_70._16_8_ != (CCallExpression *)0x0) {
      (*(((CExpression *)local_70._16_8_)->super_IExpression).super_INode._vptr_INode[2])();
    }
    local_70._16_8_ = 0;
    if ((CExpressionList *)local_98._32_8_ != (CExpressionList *)0x0) {
      (**(code **)(*(long *)local_98._32_8_ + 0x10))();
    }
    local_98._32_8_ = 0;
    if ((_func_int **)local_70._8_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_70._8_8_ + 0x10))();
    }
    local_70._8_8_ = (pointer)0x0;
    if ((_func_int **)local_70._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_70._0_8_ + 0x10))();
    }
    if ((CSeqStatement *)local_a8._M_head_impl != (CSeqStatement *)0x0) {
      (*((INode *)&((local_a8._M_head_impl)->super_IStatement).super_INode._vptr_INode)->_vptr_INode
        [2])();
    }
    local_a8._M_head_impl = (CStatement *)0x0;
    std::
    vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
    ::~vector((vector<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>,_std::allocator<std::unique_ptr<const_IRT::CStatement,_std::default_delete<const_IRT::CStatement>_>_>_>
               *)local_98);
  }
  (*((INode *)&(this_02->super_IVisitor)._vptr_IVisitor)->_vptr_INode[2])();
  return;
}

Assistant:

void IRT::CEseqFloatVisitor::Visit(const IRT::CCallExpression &expression) {
    expression.getArguments()->Accept(*this);
    std::unique_ptr<const CExpressionList> args = std::move(childExpressionList);

    if (args->getExpressions().size() == 0) {
        childExpression = EMOVE_UNIQ(new CCallExpression(
                std::move(expression.getFunction()->CopyCast()),
                std::move(args)
        ));

        return;
    }

    std::vector<std::unique_ptr<const CStatement>> helpStatements;

    CExpressionList* tempExpressionList = new CExpressionList();

    for (int i = 0; i < args->getExpressions().size(); ++i) {
        processCallArgument(args->getExpressions()[i].get(), tempExpressionList, helpStatements);
    }

    std::unique_ptr<const CStatement> rightStatement = std::move(helpStatements.back());
    helpStatements.pop_back();
    for (int i = 0; i < helpStatements.size(); ++i) {
        rightStatement = SMOVE_UNIQ(new CSeqStatement(
                std::move(helpStatements[i]),
                std::move(rightStatement)
        ));
    }

    childExpression = EMOVE_UNIQ(new CEseqExpression(
            std::move(rightStatement),
            EMOVE_UNIQ(new CCallExpression(
                    std::move(expression.getFunction()->CopyCast()),
                    std::move(std::unique_ptr<const CExpressionList>(tempExpressionList))
            ))
    ));
}